

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::
initialize<tinyusdz::Animatable<tinyusdz::Extent>>
          (optional<tinyusdz::Animatable<tinyusdz::Extent>> *this,
          Animatable<tinyusdz::Extent> *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pSVar4;
  
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::Extent>>)0x1) {
    uVar1 = *(undefined8 *)(value->_value).lower._M_elems;
    uVar2 = *(undefined8 *)((value->_value).lower._M_elems + 2);
    uVar3 = *(undefined8 *)((long)(value->_value).upper._M_elems + 6);
    *(undefined8 *)(this + 0x12) = *(undefined8 *)((long)(value->_value).lower._M_elems + 10);
    *(undefined8 *)(this + 0x1a) = uVar3;
    *(undefined8 *)(this + 8) = uVar1;
    *(undefined8 *)(this + 0x10) = uVar2;
    pSVar4 = (value->_ts)._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x30) = pSVar4;
    *(pointer *)(this + 0x38) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0x40] = (optional<tinyusdz::Animatable<tinyusdz::Extent>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<tinyusdz::Extent>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::Extent>, V = tinyusdz::Animatable<tinyusdz::Extent>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }